

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_leaf(lys_module *module,lys_node_leaf *leaf,int options,unres_schema *unres)

{
  int iVar1;
  unres_schema *unres_local;
  int options_local;
  lys_node_leaf *leaf_local;
  lys_module *module_local;
  
  iVar1 = yang_fill_type(module,&leaf->type,(yang_type *)(leaf->type).der,leaf,unres);
  if (iVar1 == 0) {
    iVar1 = yang_check_iffeatures(module,(void *)0x0,leaf,LEAF_KEYWORD,unres);
    if (iVar1 == 0) {
      iVar1 = unres_schema_add_node(module,unres,&leaf->type,UNRES_TYPE_DER,(lys_node *)leaf);
      if (iVar1 == -1) {
        yang_type_free(module->ctx,&leaf->type);
      }
      else if (((((options & 4U) != 0) ||
                (iVar1 = unres_schema_add_node
                                   (module,unres,&leaf->type,UNRES_TYPE_DFLT,(lys_node *)&leaf->dflt
                                   ), iVar1 != -1)) &&
               ((leaf->when == (lys_when *)0x0 ||
                (iVar1 = yang_check_ext_instance
                                   (module,&leaf->when->ext,(uint)leaf->when->ext_size,leaf->when,
                                    unres), iVar1 == 0)))) &&
              (iVar1 = yang_check_must(module,leaf->must,(uint)leaf->must_size,unres), iVar1 == 0))
      {
        if ((leaf->when == (lys_when *)0x0) && (leaf->must_size == '\0')) {
          return 0;
        }
        if ((options & 4U) == 0) {
          iVar1 = unres_schema_add_node(module,unres,leaf,UNRES_XPATH,(lys_node *)0x0);
          if (iVar1 != -1) {
            return 0;
          }
        }
        else {
          iVar1 = lyxp_node_check_syntax((lys_node *)leaf);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
    }
    else {
      yang_type_free(module->ctx,&leaf->type);
    }
  }
  else {
    yang_type_free(module->ctx,&leaf->type);
  }
  return 1;
}

Assistant:

static int
yang_check_leaf(struct lys_module *module, struct lys_node_leaf *leaf, int options, struct unres_schema *unres)
{
    if (yang_fill_type(module, &leaf->type, (struct yang_type *)leaf->type.der, leaf, unres)) {
        yang_type_free(module->ctx, &leaf->type);
        goto error;
    }
    if (yang_check_iffeatures(module, NULL, leaf, LEAF_KEYWORD, unres)) {
        yang_type_free(module->ctx, &leaf->type);
        goto error;
    }

    if (unres_schema_add_node(module, unres, &leaf->type, UNRES_TYPE_DER, (struct lys_node *)leaf) == -1) {
        yang_type_free(module->ctx, &leaf->type);
        goto error;
    }

    if (!(options & LYS_PARSE_OPT_INGRP) &&
            (unres_schema_add_node(module, unres, &leaf->type, UNRES_TYPE_DFLT, (struct lys_node *)&leaf->dflt) == -1)) {
        goto error;
    }

    if (leaf->when && yang_check_ext_instance(module, &leaf->when->ext, leaf->when->ext_size, leaf->when, unres)) {
        goto error;
    }
    if (yang_check_must(module, leaf->must, leaf->must_size, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (leaf->when || leaf->must_size) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)leaf)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, leaf, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;
error:
    return EXIT_FAILURE;
}